

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O2

bool FIX::Message::isHeaderField(int field,DataDictionary *pD)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = isHeaderField(field);
  bVar2 = true;
  if (!bVar1) {
    if (pD != (DataDictionary *)0x0) {
      bVar1 = DataDictionary::isHeaderField(pD,field);
      return bVar1;
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Message::isHeaderField( int field, 
                             const DataDictionary * pD )
{
  if ( isHeaderField( field ) ) return true;
  if ( pD ) return pD->isHeaderField( field );
  return false;
}